

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

bool __thiscall google::protobuf::internal::ExtensionSet::IsInitialized(ExtensionSet *this)

{
  byte bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  LogMessage *other;
  Type *pTVar6;
  _Base_ptr p_Var7;
  _Rb_tree_header *p_Var8;
  bool bVar9;
  LogFinisher local_69;
  LogMessage local_68;
  
  p_Var7 = (this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var8 = &(this->extensions_)._M_t._M_impl.super__Rb_tree_header;
  bVar9 = (_Rb_tree_header *)p_Var7 == p_Var8;
  if (!bVar9) {
    do {
      bVar1 = *(byte *)&p_Var7[1]._M_left;
      if ((byte)(bVar1 - 0x13) < 0xee) {
        LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                   ,0x34);
        other = LogMessage::operator<<
                          (&local_68,
                           "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
        LogFinisher::operator=(&local_69,other);
        LogMessage::~LogMessage(&local_68);
      }
      if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) == 10) {
        if (*(char *)((long)&p_Var7[1]._M_left + 1) == '\x01') {
          iVar4 = *(int *)&(p_Var7[1]._M_parent)->_M_parent;
          bVar2 = 0 < iVar4;
          if (0 < iVar4) {
            pTVar6 = RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                               ((RepeatedPtrFieldBase *)p_Var7[1]._M_parent,0);
            iVar4 = (*pTVar6->_vptr_MessageLite[8])(pTVar6);
            if ((char)iVar4 != '\0') {
              iVar4 = 1;
              do {
                iVar5 = *(int *)&(p_Var7[1]._M_parent)->_M_parent;
                bVar2 = iVar4 < iVar5;
                if (iVar5 <= iVar4) goto LAB_005f2aa8;
                pTVar6 = RepeatedPtrFieldBase::
                         Get<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                                   ((RepeatedPtrFieldBase *)p_Var7[1]._M_parent,iVar4);
                iVar5 = (*pTVar6->_vptr_MessageLite[8])(pTVar6);
                iVar4 = iVar4 + 1;
              } while ((char)iVar5 != '\0');
            }
            if (bVar2) {
              return bVar9;
            }
          }
        }
        else if (((ulong)p_Var7[1]._M_left & 0x10000) == 0) {
          if (((ulong)p_Var7[1]._M_left & 0x100000) == 0) {
            cVar3 = (**(code **)(*(long *)p_Var7[1]._M_parent + 0x40))();
          }
          else {
            cVar3 = (**(code **)(*(long *)p_Var7[1]._M_parent + 0x48))();
          }
          if (cVar3 == '\0') {
            return bVar9;
          }
        }
      }
LAB_005f2aa8:
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
      bVar9 = (_Rb_tree_header *)p_Var7 == p_Var8;
    } while (!bVar9);
  }
  return bVar9;
}

Assistant:

bool ExtensionSet::IsInitialized() const {
  // Extensions are never required.  However, we need to check that all
  // embedded messages are initialized.
  for (ExtensionMap::const_iterator iter = extensions_.begin();
       iter != extensions_.end(); ++iter) {
    const Extension& extension = iter->second;
    if (cpp_type(extension.type) == WireFormatLite::CPPTYPE_MESSAGE) {
      if (extension.is_repeated) {
        for (int i = 0; i < extension.repeated_message_value->size(); i++) {
          if (!extension.repeated_message_value->Get(i).IsInitialized()) {
            return false;
          }
        }
      } else {
        if (!extension.is_cleared) {
          if (extension.is_lazy) {
            if (!extension.lazymessage_value->IsInitialized()) return false;
          } else {
            if (!extension.message_value->IsInitialized()) return false;
          }
        }
      }
    }
  }

  return true;
}